

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

PerspectiveCameraData * __thiscall
embree::SceneGraph::AnimatedPerspectiveCameraNode::get
          (AnimatedPerspectiveCameraNode *this,float time)

{
  size_type sVar1;
  long in_RSI;
  PerspectiveCameraData *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float ftime;
  int itime;
  int local_10c;
  int local_104;
  float t;
  PerspectiveCameraData *in_stack_ffffffffffffff28;
  PerspectiveCameraData *in_stack_ffffffffffffff30;
  undefined1 local_98 [68];
  float local_54;
  int local_50;
  float local_4c;
  float local_34;
  float *local_30;
  float local_28;
  float local_24;
  int local_20;
  int local_1c;
  undefined4 local_18;
  int local_14;
  const_reference local_10;
  const_reference local_8;
  
  local_30 = (float *)(in_RSI + 0xb0);
  fVar2 = (in_XMM0_Da - *(float *)(in_RSI + 0xb0)) / (*(float *)(in_RSI + 0xb4) - *local_30);
  local_34 = fVar2;
  local_28 = fVar2;
  local_4c = floorf(fVar2);
  local_4c = fVar2 - local_4c;
  sVar1 = std::
          vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          ::size((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                  *)(in_RSI + 0xb8));
  t = (float)(sVar1 - 1);
  local_4c = t * local_4c;
  local_24 = local_4c;
  fVar2 = floorf(local_4c);
  local_50 = (int)fVar2;
  local_18 = 0;
  local_104 = local_50;
  if (local_50 < 0) {
    local_104 = 0;
  }
  local_14 = local_50;
  sVar1 = std::
          vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          ::size((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                  *)(in_RSI + 0xb8));
  local_20 = (int)sVar1 + -2;
  local_1c = local_104;
  local_10c = local_20;
  if (local_104 < local_20) {
    local_10c = local_104;
  }
  local_50 = local_10c;
  local_54 = local_4c - (float)local_10c;
  local_8 = std::
            vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
            ::operator[]((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                          *)(in_RSI + 0xb8),(long)local_10c);
  (*(local_8->ptr->super_Node).super_RefCount._vptr_RefCount[0x10])(local_4c,local_98);
  local_10 = std::
             vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
             ::operator[]((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                           *)(in_RSI + 0xb8),(long)(local_50 + 1));
  (*(local_10->ptr->super_Node).super_RefCount._vptr_RefCount[0x10])
            (local_4c,&stack0xffffffffffffff28);
  lerp(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,t);
  return in_RDI;
}

Assistant:

virtual PerspectiveCameraData get(float time) const
      {
        time = frac((time-time_range.lower)/time_range.size());
        time = (cameras.size()-1)*time;
        int   itime = (int)floor(time);
        itime = min(max(itime,0),(int)cameras.size()-2);
        float ftime = time - (float)itime;
        return lerp(cameras[itime+0]->get(time), cameras[itime+1]->get(time), ftime);
      }